

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O3

char * libssh2_session_hostkey(LIBSSH2_SESSION *session,size_t *len,int *type)

{
  uint uVar1;
  long *plVar2;
  int iVar3;
  
  uVar1 = session->server_hostkey_len;
  if ((ulong)uVar1 == 0) {
    if (len != (size_t *)0x0) {
      *len = 0;
    }
    plVar2 = (long *)0x0;
  }
  else {
    if (len != (size_t *)0x0) {
      *len = (ulong)uVar1;
    }
    plVar2 = (long *)session->server_hostkey;
    if (type != (int *)0x0) {
      iVar3 = 0;
      if (10 < uVar1) {
        if (*(long *)((long)plVar2 + 3) == 0x6173722d68737307 && *plVar2 == 0x2d68737307000000) {
          iVar3 = 1;
        }
        else {
          iVar3 = (uint)(*(long *)((long)plVar2 + 3) == 0x7373642d68737307 &&
                        *plVar2 == 0x2d68737307000000) * 2;
        }
      }
      *type = iVar3;
      return (char *)plVar2;
    }
  }
  return (char *)plVar2;
}

Assistant:

LIBSSH2_API const char *
libssh2_session_hostkey(LIBSSH2_SESSION *session, size_t *len, int *type)
{
    if(session->server_hostkey_len) {
        if(len)
            *len = session->server_hostkey_len;
        if (type)
            *type = hostkey_type(session->server_hostkey,
                                 session->server_hostkey_len);
        return (char *) session->server_hostkey;
    }
    if(len)
        *len = 0;
    return NULL;
}